

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

optional<pbrt::Camera> __thiscall
pbrt::AsyncJob<pbrt::Camera>::TryGetResult(AsyncJob<pbrt::Camera> *this,mutex *extMutex)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  optional<pbrt::Camera> *in_RSI;
  aligned_storage_t<sizeof(pbrt::Camera),_alignof(pbrt::Camera)> in_RDI;
  optional<pbrt::Camera> oVar3;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  aligned_storage_t<sizeof(pbrt::Camera),_alignof(pbrt::Camera)> v;
  
  v = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffa8);
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(in_RSI + 5));
  if (bVar1) {
    pstd::optional<pbrt::Camera>::optional(in_RSI,(optional<pbrt::Camera> *)v);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x54bf01);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    std::mutex::unlock((mutex *)0x54bf17);
    DoParallelWork();
    std::mutex::lock((mutex *)in_RDI);
    memset((void *)in_RDI,0,0x10);
    pstd::optional<pbrt::Camera>::optional((optional<pbrt::Camera> *)in_RDI);
    uVar2 = extraout_RDX_00;
  }
  oVar3._8_8_ = uVar2;
  oVar3.optionalValue = v;
  return oVar3;
}

Assistant:

pstd::optional<T> TryGetResult(std::mutex *extMutex) {
        {
            std::lock_guard<std::mutex> lock(mutex);
            if (result)
                return result;
        }

        extMutex->unlock();
        DoParallelWork();
        extMutex->lock();
        return {};
    }